

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayTex3DValidation.cpp
# Opt level: O2

bool __thiscall
glcts::TextureCubeMapArrayTex3DValidation::checkError
          (TextureCubeMapArrayTex3DValidation *this,GLint expectedError,char *message)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [384];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != expectedError) {
    local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,message);
    std::operator<<((ostream *)this_00," Expected error: ");
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = expectedError;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," Current error: ");
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return iVar1 == expectedError;
}

Assistant:

bool TextureCubeMapArrayTex3DValidation::checkError(glw::GLint expectedError, const char* message)
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	glw::GLint			  error  = gl.getError();
	bool				  result = true;

	if (error != expectedError)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << message << " Expected error: " << glu::getErrorStr(expectedError)
						   << " Current error: " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		result = false;
	}

	return result;
}